

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O2

Offset __thiscall
wabt::interp::Istream::Trace(Istream *this,Stream *stream,Offset offset,TraceSource *source)

{
  undefined4 uVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Instr instr;
  undefined8 local_98 [4];
  u32 local_78;
  Offset offset_local;
  undefined8 local_70 [4];
  undefined8 local_50 [4];
  
  offset_local = offset;
  Read(&instr,this,&offset_local);
  (*source->_vptr_TraceSource[2])(local_98,source,(ulong)offset);
  uVar4 = local_98[0];
  pcVar2 = Opcode::GetName(&instr.op);
  Stream::Writef(stream,"%s| %s",uVar4,pcVar2);
  std::__cxx11::string::_M_dispose();
  uVar1 = instr.field_2.imm_u32;
  switch(instr.kind) {
  case Imm_0_Op_0:
    Stream::Writef(stream,"\n");
    break;
  case Imm_0_Op_1:
    (*source->_vptr_TraceSource[3])(local_98,source,1);
    Stream::Writef(stream," %s\n",local_98[0]);
    goto LAB_00170015;
  case Imm_0_Op_2:
    (*source->_vptr_TraceSource[3])(local_98,source,2);
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," %s, %s\n",local_98[0],local_70[0]);
    goto LAB_0017000a;
  case Imm_0_Op_3:
    (*source->_vptr_TraceSource[3])(local_98,source,3);
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," %s, %s, %s\n",local_98[0],local_70[0],local_50[0]);
    goto LAB_0016ff41;
  case Imm_Jump_Op_0:
    pcVar2 = " @%u\n";
    goto LAB_0016fa43;
  case Imm_Jump_Op_1:
    (*source->_vptr_TraceSource[3])(local_98,source,1);
    pcVar2 = " @%u, %s\n";
    goto LAB_0016ff8d;
  case Imm_Index_Op_0:
  case Imm_Index_Op_N:
    pcVar2 = " $%u\n";
    goto LAB_0016fa43;
  case Imm_Index_Op_1:
    (*source->_vptr_TraceSource[3])(local_98,source,1);
    pcVar2 = " $%u, %s\n";
LAB_0016ff8d:
    Stream::Writef(stream,pcVar2,(ulong)instr.field_2.imm_u32,local_98[0]);
    goto LAB_00170015;
  case Imm_Index_Op_2:
    (*source->_vptr_TraceSource[3])(local_98,source,2);
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," $%u, %s, %s\n",(ulong)instr.field_2.imm_u32,local_98[0],local_70[0]);
    goto LAB_0017000a;
  case Imm_Index_Op_3:
    (*source->_vptr_TraceSource[3])(local_98,source,3);
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    uVar4 = CONCAT44(instr.field_2._12_4_,instr.field_2._8_4_);
    uVar3 = CONCAT44(instr.kind,instr.op.enum_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u, %s, %s, %s\n",(ulong)(uint)uVar1,local_98[0],local_70[0],
                   local_50[0],uVar3,instr.field_2.imm_u32,uVar4);
LAB_0016ff41:
    std::__cxx11::string::_M_dispose();
    goto LAB_0016ff49;
  case Imm_Index_Index_Op_3:
    local_78 = instr.field_2.imm_u32x2.snd;
    (*source->_vptr_TraceSource[3])(local_98,source,3);
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    uVar4 = CONCAT44(instr.field_2._12_4_,instr.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u, $%u, %s, %s, %s\n",(ulong)(uint)uVar1,(ulong)local_78,local_98[0],
                   local_70[0],local_50[0],instr.field_2.imm_u32,uVar4);
    std::__cxx11::string::_M_dispose();
    goto LAB_0016ff49;
  case Imm_Index_Index_Op_N:
    pcVar2 = " $%u, $%u\n";
    goto LAB_0016fdb4;
  case Imm_Index_Offset_Op_1:
    (*source->_vptr_TraceSource[3])(local_98,source,1);
    Stream::Writef(stream," $%u:%s+$%u\n",(ulong)instr.field_2.imm_u32,local_98[0],
                   (ulong)instr.field_2.imm_u32x2.snd);
    goto LAB_00170015;
  case Imm_Index_Offset_Op_2:
    (*source->_vptr_TraceSource[3])(local_98,source,2);
    uVar4 = CONCAT44(instr.field_2._12_4_,instr.field_2._8_4_);
    uVar3 = CONCAT44(instr.kind,instr.op.enum_);
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," $%u:%s+$%u, %s\n",(ulong)(uint)uVar1,local_98[0],
                   (ulong)instr.field_2.imm_u32x2.snd,local_70[0],uVar3,instr.field_2.imm_u32,uVar4)
    ;
    goto LAB_0016ff49;
  case Imm_Index_Offset_Op_3:
    (*source->_vptr_TraceSource[3])(local_98,source,3);
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    uVar4 = CONCAT44(instr.field_2._12_4_,instr.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u:%s+$%u, %s, %s\n",(ulong)(uint)uVar1,local_98[0],
                   (ulong)instr.field_2.imm_u32x2.snd,local_70[0],local_50[0],instr.field_2.imm_u32,
                   uVar4);
    std::__cxx11::string::_M_dispose();
LAB_0016ff49:
    std::__cxx11::string::_M_dispose();
    goto LAB_00170015;
  case Imm_I32_Op_0:
    pcVar2 = " %u\n";
LAB_0016fa43:
    Stream::Writef(stream,pcVar2,(ulong)instr.field_2.imm_u32);
    break;
  case Imm_I64_Op_0:
    Stream::Writef(stream," %lu\n",CONCAT44(instr.field_2.imm_u32x2.snd,instr.field_2.imm_u32));
    break;
  case Imm_F32_Op_0:
    instr.field_2.imm_u32 = SUB84((double)(float)instr.field_2.imm_f32,0);
    goto LAB_00170036;
  case Imm_F64_Op_0:
LAB_00170036:
    Stream::Writef(stream," %g\n",instr.field_2.imm_u32);
    break;
  case Imm_I32_I32_Op_0:
    pcVar2 = " $%u $%u\n";
LAB_0016fdb4:
    Stream::Writef(stream,pcVar2,(ulong)instr.field_2.imm_u32,(ulong)instr.field_2.imm_u32x2.snd);
    break;
  case Imm_I8_Op_1:
    (*source->_vptr_TraceSource[3])(local_98,source,1);
    Stream::Writef(stream," %s : (Lane imm: %u)\n",local_98[0],(ulong)instr.field_2.imm_u8);
    goto LAB_00170015;
  case Imm_I8_Op_2:
    (*source->_vptr_TraceSource[3])(local_98,source,2);
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," %s, %s : (Lane imm: $%u)\n",local_98[0],local_70[0],
                   (ulong)instr.field_2.imm_u8);
    goto LAB_0017000a;
  case Imm_V128_Op_0:
    Stream::Writef(stream," i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",(ulong)instr.field_2.imm_u32,
                   (ulong)instr.field_2.imm_u32x2.snd,(ulong)(uint)instr.field_2._8_4_,
                   (ulong)(uint)instr.field_2._12_4_);
    break;
  case Imm_V128_Op_2:
    (*source->_vptr_TraceSource[3])(local_98,source,2);
    uVar4 = CONCAT44(instr.field_2._12_4_,instr.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",local_98[0],
                   local_70[0],(ulong)instr.field_2.imm_u32,(ulong)instr.field_2.imm_u32x2.snd,
                   CONCAT44(instr.kind,instr.field_2._8_4_),instr.field_2._12_4_,uVar4);
LAB_0017000a:
    std::__cxx11::string::_M_dispose();
LAB_00170015:
    std::__cxx11::string::_M_dispose();
  }
  return offset_local;
}

Assistant:

Istream::Offset Istream::Trace(Stream* stream,
                               Offset offset,
                               TraceSource* source) const {
  Offset start = offset;
  Instr instr = Read(&offset);
  stream->Writef("%s| %s", source->Header(start).c_str(), instr.op.GetName());

  switch (instr.kind) {
    case InstrKind::Imm_0_Op_0:
      stream->Writef("\n");
      break;

    case InstrKind::Imm_0_Op_1:
      stream->Writef(" %s\n", source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_2:
      stream->Writef(" %s, %s\n", source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_3:
      stream->Writef(" %s, %s, %s\n", source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Jump_Op_0:
      stream->Writef(" @%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Jump_Op_1:
      stream->Writef(" @%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_0:
      stream->Writef(" $%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Index_Op_1:
      stream->Writef(" $%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_2:
      stream->Writef(" $%u, %s, %s\n", instr.imm_u32,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_3:
      stream->Writef(
          " $%u, %s, %s, %s\n", instr.imm_u32, source->Pick(3, instr).c_str(),
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_N:
      stream->Writef(" $%u\n", instr.imm_u32); // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Index_Op_3:
      stream->Writef(" $%u, $%u, %s, %s, %s\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd, source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Index_Op_N:
      stream->Writef(" $%u, $%u\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd);  // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Offset_Op_1:
      stream->Writef(" $%u:%s+$%u\n", instr.imm_u32x2.fst,
                     source->Pick(1, instr).c_str(), instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_Index_Offset_Op_2:
      stream->Writef(" $%u:%s+$%u, %s\n", instr.imm_u32x2.fst,
                     source->Pick(2, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Offset_Op_3:
      stream->Writef(" $%u:%s+$%u, %s, %s\n", instr.imm_u32x2.fst,
                     source->Pick(3, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_I32_Op_0:
      stream->Writef(" %u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_I64_Op_0:
      stream->Writef(" %" PRIu64 "\n", instr.imm_u64);
      break;

    case InstrKind::Imm_F32_Op_0:
      stream->Writef(" %g\n", instr.imm_f32);
      break;

    case InstrKind::Imm_F64_Op_0:
      stream->Writef(" %g\n", instr.imm_f64);
      break;

    case InstrKind::Imm_I32_I32_Op_0:
      stream->Writef(" $%u $%u\n", instr.imm_u32x2.fst, instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_I8_Op_1:
      // TODO: cleanup
      stream->Writef(" %s : (Lane imm: %u)\n", source->Pick(1, instr).c_str(),
                     instr.imm_u8);
      break;

    case InstrKind::Imm_I8_Op_2:
      // TODO: cleanup
      stream->Writef(" %s, %s : (Lane imm: $%u)\n",
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str(), instr.imm_u8);
      break;

    case InstrKind::Imm_V128_Op_0:
      stream->Writef(" i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",
                     instr.imm_v128.u32(0), instr.imm_v128.u32(1),
                     instr.imm_v128.u32(2), instr.imm_v128.u32(3));
      break;

    case InstrKind::Imm_V128_Op_2:
      // TODO: cleanup
      stream->Writef(
          " %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str(),
          instr.imm_v128.u32(0), instr.imm_v128.u32(1), instr.imm_v128.u32(2),
          instr.imm_v128.u32(3));
      break;
  }
  return offset;
}